

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void rapidjson::SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
               (GenericStringStream<rapidjson::UTF8<char>_> *is)

{
  Ch CVar1;
  GenericStringStream<rapidjson::UTF8<char>_> *in_RDI;
  bool bVar2;
  Ch c;
  GenericStringStream<rapidjson::UTF8<char>_> *s;
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> copy;
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> local_20;
  
  internal::StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1>::
  StreamLocalCopy(&local_20,in_RDI);
  while( true ) {
    CVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(&local_20.s);
    bVar2 = true;
    if (((CVar1 != ' ') && (bVar2 = true, CVar1 != '\n')) && (bVar2 = true, CVar1 != '\r')) {
      bVar2 = CVar1 == '\t';
    }
    if (!bVar2) break;
    GenericStringStream<rapidjson::UTF8<char>_>::Take(&local_20.s);
  }
  internal::StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1>::
  ~StreamLocalCopy(&local_20);
  return;
}

Assistant:

void SkipWhitespace(InputStream& is) {
    internal::StreamLocalCopy<InputStream> copy(is);
    InputStream& s(copy.s);

    typename InputStream::Ch c;
    while ((c = s.Peek()) == ' ' || c == '\n' || c == '\r' || c == '\t')
        s.Take();
}